

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmFuncts.cpp
# Opt level: O3

string * AsmFuncts::getFuncCode(string *__return_storage_ptr__,string *op)

{
  size_t __n;
  size_t sVar1;
  int iVar2;
  long lVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer ppVar6;
  
  if ((long)Codes::typeROp_abi_cxx11_.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)Codes::typeROp_abi_cxx11_.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar3 = (long)Codes::typeROp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)Codes::typeROp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
    __n = op->_M_string_length;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    ppVar6 = Codes::typeROp_abi_cxx11_.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar1 = (ppVar6->second)._M_string_length;
      if (__n == sVar1) {
        if ((__n == 0) ||
           (iVar2 = bcmp((op->_M_dataplus)._M_p,(ppVar6->second)._M_dataplus._M_p,__n), iVar2 == 0))
        {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar4 = (ppVar6->first)._M_dataplus._M_p;
          pcVar5 = pcVar4 + (ppVar6->first)._M_string_length;
          goto LAB_001258e2;
        }
        if (__n == (ppVar6->first)._M_string_length) goto LAB_0012587c;
      }
      else if (__n == (ppVar6->first)._M_string_length) {
        if (__n != 0) {
LAB_0012587c:
          iVar2 = bcmp((op->_M_dataplus)._M_p,(ppVar6->first)._M_dataplus._M_p,__n);
          if (iVar2 != 0) goto LAB_0012588f;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = (ppVar6->second)._M_dataplus._M_p;
        pcVar5 = pcVar4 + sVar1;
LAB_001258e2:
        std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar4,pcVar5);
        return __return_storage_ptr__;
      }
LAB_0012588f:
      ppVar6 = ppVar6 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"000000","");
  return __return_storage_ptr__;
}

Assistant:

string AsmFuncts::getFuncCode(string op) {
    for (int i = 0; i < Codes::typeROp.size(); i++) {
        if(op == Codes::typeROp[i].second)
            return Codes::typeROp[i].first;
        if(op == Codes::typeROp[i].first)
            return Codes::typeROp[i].second;
    }
    return "000000";
}